

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint *puVar15;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  bool bVar19;
  char buffer [8];
  undefined8 local_38;
  
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar4 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,bmi2);
    sVar5 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sVar5 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sVar5 = sVar4;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar11 = *headerBuffer & 0xf;
    sVar5 = 0xffffffffffffffd4;
    if (uVar11 < 0xb) {
      uVar7 = *headerBuffer >> 4;
      *tableLogPtr = uVar11 + 5;
      iVar16 = 0x20 << (sbyte)uVar11;
      uVar14 = iVar16 + 1;
      iVar12 = uVar11 + 6;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar18 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar19 = true;
      uVar11 = 4;
      uVar13 = 0;
      puVar15 = (uint *)headerBuffer;
      do {
        if (!bVar19) {
          uVar6 = 0;
          if ((~uVar7 | 0x80000000) != 0) {
            for (; ((~uVar7 | 0x80000000) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          while (0x17 < uVar6) {
            if (puVar2 < puVar15) {
              uVar11 = uVar11 + ((int)puVar15 - (int)puVar2) * 8 & 0x1f;
              puVar15 = puVar18;
            }
            else {
              puVar15 = (uint *)((long)puVar15 + 3);
            }
            uVar7 = *puVar15 >> ((byte)uVar11 & 0x1f);
            uVar6 = 0;
            if ((~uVar7 | 0x80000000) != 0) {
              for (; ((~uVar7 | 0x80000000) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar13 = uVar13 + 0x24;
          }
          uVar7 = uVar7 >> ((byte)(uVar6 & 0xfffffffe) & 0x1f);
          if ((uVar7 & 3) == 3) {
            __assert_fail("(bitStream & 3) < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,0x6a,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          uVar13 = uVar13 + (uVar6 >> 1) * 3 + (uVar7 & 3);
          uVar11 = uVar11 + (uVar6 & 0xfffffffe) + 2;
          if (uVar13 < uVar8) {
            iVar10 = (int)uVar11 >> 3;
            if ((puVar2 < puVar15) && (puVar18 < (uint *)((long)iVar10 + (long)puVar15))) {
              uVar11 = uVar11 + ((int)puVar15 - (int)puVar18) * 8 & 0x1f;
              puVar15 = puVar18;
            }
            else {
              if (3 < iVar10) {
                __assert_fail("(bitCount >> 3) <= 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                              ,0x79,
                              "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                             );
              }
              uVar11 = uVar11 & 7;
              puVar15 = (uint *)((long)puVar15 + (long)iVar10);
            }
            uVar7 = *puVar15 >> (sbyte)uVar11;
          }
          if (uVar8 <= uVar13) break;
        }
        uVar6 = iVar16 * 2 - 1;
        uVar9 = uVar6 - uVar14;
        uVar17 = iVar16 - 1U & uVar7;
        if (uVar17 < uVar9) {
          iVar10 = iVar12 + -1;
        }
        else {
          uVar6 = uVar6 & uVar7;
          if ((int)uVar6 < iVar16) {
            uVar9 = 0;
          }
          uVar17 = uVar6 - uVar9;
          iVar10 = iVar12;
        }
        iVar1 = uVar17 - 1;
        if ((int)uVar17 < 1) {
          if (uVar17 != 0) {
            __assert_fail("count == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,0x97,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          uVar14 = uVar14 - 1;
        }
        else {
          uVar14 = uVar14 - iVar1;
        }
        normalizedCounter[uVar13] = (short)iVar1;
        bVar19 = iVar1 != 0;
        if (iVar16 < 2) {
          __assert_fail("threshold > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                        ,0x9d,
                        "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                       );
        }
        uVar11 = iVar10 + uVar11;
        uVar13 = uVar13 + 1;
        if ((int)uVar14 < iVar16) {
          if (1 < (int)uVar14) {
            uVar6 = 0x1f;
            if (uVar14 != 0) {
              for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            iVar12 = (uVar6 ^ 0xffffffe0) + 0x21;
            iVar16 = 1 << ((byte)uVar6 & 0x1f);
            goto LAB_00216136;
          }
LAB_00216159:
          bVar3 = false;
        }
        else {
LAB_00216136:
          if (uVar8 <= uVar13) goto LAB_00216159;
          iVar10 = (int)uVar11 >> 3;
          if ((puVar2 < puVar15) && (puVar18 < (uint *)((long)iVar10 + (long)puVar15))) {
            uVar11 = uVar11 + ((int)puVar15 - (int)puVar18) * 8 & 0x1f;
            puVar15 = puVar18;
          }
          else {
            uVar11 = uVar11 & 7;
            puVar15 = (uint *)((long)puVar15 + (long)iVar10);
          }
          uVar7 = *puVar15 >> (sbyte)uVar11;
          bVar3 = true;
        }
      } while (bVar3);
      sVar5 = 0xffffffffffffffec;
      if (((uVar14 == 1) && (sVar5 = 0xffffffffffffffd0, uVar13 <= uVar8)) &&
         (sVar5 = 0xffffffffffffffec, (int)uVar11 < 0x21)) {
        *maxSVPtr = uVar13 - 1;
        sVar5 = (long)puVar15 + ((long)((int)(uVar11 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar5;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}